

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O0

void __thiscall Node::VariableScanOne(Node *this,int InDefineFlag)

{
  pointer *pppNVar1;
  Node *pNVar2;
  int iVar3;
  reference pcVar4;
  VariableStruct *pVVar5;
  Node *pNVar6;
  allocator local_559;
  string local_558 [38];
  undefined1 local_532;
  allocator local_531;
  string local_530 [38];
  undefined1 local_50a;
  allocator local_509;
  string local_508 [38];
  undefined1 local_4e2;
  allocator local_4e1;
  string local_4e0 [38];
  undefined1 local_4ba;
  allocator local_4b9;
  string local_4b8 [38];
  undefined1 local_492;
  allocator local_491;
  string local_490 [38];
  undefined1 local_46a;
  allocator local_469;
  string local_468 [32];
  string local_448 [36];
  VARTYPE local_424;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420 [4];
  VARTYPE Type1;
  string Merger;
  string local_400 [32];
  undefined1 local_3e0 [8];
  VariableStruct NewVar_4;
  undefined1 local_328 [8];
  VariableStruct NewVar_3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  undefined8 local_278;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268;
  string local_260 [32];
  undefined1 local_240 [8];
  VariableStruct NewVar_2;
  undefined1 local_188 [8];
  VariableStruct NewVar_1;
  string local_e0 [32];
  undefined1 local_c0 [8];
  VariableStruct NewVar;
  VARTYPE ThisType;
  VariableStruct *ThisVar;
  int InDefineFlag_local;
  Node *this_local;
  
  NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._4_4_ = 0;
  iVar3 = this->Type;
  if (iVar3 == 0x2b) {
    VariableScanOne(this->Tree[0],InDefineFlag);
    VariableScanOne(this->Tree[1],InDefineFlag);
    iVar3 = IsReallyString(this->Tree[0]);
    if ((iVar3 != 0) && (iVar3 = IsReallyString(this->Tree[1]), iVar3 != 0)) {
      std::operator+(local_420,&this->Tree[0]->TextValue);
      this->Type = 0x1d4;
      pNVar2 = this->Tree[0];
      if (pNVar2 != (Node *)0x0) {
        ~Node(pNVar2);
        operator_delete(pNVar2,0x70);
      }
      this->Tree[0] = (Node *)0x0;
      pNVar2 = this->Tree[1];
      if (pNVar2 != (Node *)0x0) {
        ~Node(pNVar2);
        operator_delete(pNVar2,0x70);
      }
      this->Tree[1] = (Node *)0x0;
      std::__cxx11::string::operator=((string *)&this->TextValue,(string *)local_420);
      std::__cxx11::string::~string((string *)local_420);
    }
  }
  else if (iVar3 == 0x111) {
    ScanVarList(this->Tree[0],VARTYPE_VOID,VARCLASS_FUNC,0);
  }
  else if (iVar3 == 0x115) {
    local_424 = 6;
    if (this->Tree[1]->Type == 0x1d3) {
      pVVar5 = VariableList::Lookup(Variables,&this->Tree[1]->TextValue,(Node *)0x0,0);
      if ((pVVar5 == (VariableStruct *)0x0) || (pVVar5->Type != VARTYPE_DYNSTR)) {
        std::__cxx11::string::string(local_448,(string *)&this->Tree[0]->TextValue);
        local_424 = GuessVarType((string *)local_448);
        std::__cxx11::string::~string(local_448);
      }
      else {
        local_424 = pVVar5->Type;
      }
    }
    else {
      local_424 = VARTYPE_DYNSTR;
    }
    if (local_424 == VARTYPE_DYNSTR) {
      this->Type = 0x117;
      pNVar2 = this->Tree[0];
      pNVar6 = (Node *)operator_new(0x70);
      local_46a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_468,"",&local_469);
      Node(pNVar6,0x203,(string *)local_468,0,0);
      local_46a = 0;
      Link(pNVar2,pNVar6,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
      std::__cxx11::string::~string(local_468);
      std::allocator<char>::~allocator((allocator<char> *)&local_469);
    }
    else {
      this->Type = 0x116;
      pNVar2 = this->Tree[1];
      pNVar6 = (Node *)operator_new(0x70);
      local_492 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_490,"",&local_491);
      Node(pNVar6,0x203,(string *)local_490,0,0);
      local_492 = 0;
      Link(pNVar2,pNVar6,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
      std::__cxx11::string::~string(local_490);
      std::allocator<char>::~allocator((allocator<char> *)&local_491);
    }
    VariableScan(this->Tree[0],InDefineFlag);
    VariableScan(this->Tree[1],InDefineFlag);
  }
  else if (iVar3 == 0x11b) {
    ScanMap(this);
  }
  else if (iVar3 != 0x122) {
    if (iVar3 == 0x124) {
      ScanVarList(this->Tree[0],VARTYPE_REAL,VARCLASS_NONE,1);
    }
    else if (1 < iVar3 - 0x125U) {
      if (iVar3 == 299) {
        if (this->Tree[1] != (Node *)0x0) {
          VariableScanOne(this->Tree[1],1);
        }
        ScanVarList(this->Tree[0],VARTYPE_REAL,VARCLASS_NONE,1);
      }
      else if (iVar3 == 0x137) {
        ScanVarList(this->Tree[0],VARTYPE_REAL,VARCLASS_NONE,1);
      }
      else {
        if (iVar3 != 0x143) {
          if (iVar3 == 0x144) {
            if (this->Tree[0] == (Node *)0x0) {
              NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = VARTYPE_VOID;
            }
            else {
              NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = ScanType(this->Tree[0]);
            }
            pVVar5 = VariableList::Lookup(Variables,&this->Tree[2]->TextValue,this,0);
            if (pVVar5 == (VariableStruct *)0x0) {
              std::__cxx11::string::string(local_260,(string *)&this->Tree[2]->TextValue);
              VariableStruct::VariableStruct
                        ((VariableStruct *)local_240,(string *)local_260,
                         NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,VARCLASS_FUNC,InDefineFlag,
                         0);
              std::__cxx11::string::~string(local_260);
              VariableList::Append(Variables,(VariableStruct *)local_240,1);
              VariableStruct::~VariableStruct((VariableStruct *)local_240);
            }
            else {
              pVVar5->Class = VARCLASS_FUNC;
              pVVar5->Type = NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            }
            if (this->Tree[2]->Tree[0] == (Node *)0x0) {
              return;
            }
            VariableScan(this->Tree[2]->Tree[0],1);
            return;
          }
          if (iVar3 == 0x14b) {
            GosubFlag = 1;
            VariableScanOne(this->Tree[0],InDefineFlag);
            return;
          }
          if (iVar3 == 0x161) {
            ScanMap(this);
            return;
          }
          if (iVar3 == 0x163) {
            pNVar2 = this->Tree[0];
            pNVar6 = (Node *)operator_new(0x70);
            local_4ba = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_4b8,"",&local_4b9);
            Node(pNVar6,0x203,(string *)local_4b8,0,0);
            local_4ba = 0;
            Link(pNVar2,pNVar6,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
            std::__cxx11::string::~string(local_4b8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
            VariableScan(this->Tree[0],InDefineFlag);
            iVar3 = this->Tree[1]->Type;
            if (iVar3 == 0x28) {
              pNVar2 = this->Tree[1]->Tree[1];
              pNVar6 = (Node *)operator_new(0x70);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_558,"",&local_559);
              Node(pNVar6,0x203,(string *)local_558,0,0);
              Link(pNVar2,pNVar6,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
              std::__cxx11::string::~string(local_558);
              std::allocator<char>::~allocator((allocator<char> *)&local_559);
              VariableScan(this->Tree[1]->Tree[0],InDefineFlag);
              VariableScan(this->Tree[1]->Tree[1],InDefineFlag);
              return;
            }
            if ((iVar3 - 0x2aU < 2) || (iVar3 == 0x2d)) {
              pNVar2 = this->Tree[1]->Tree[0];
              pNVar6 = (Node *)operator_new(0x70);
              local_50a = 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_508,"",&local_509);
              Node(pNVar6,0x203,(string *)local_508,0,0);
              local_50a = 0;
              Link(pNVar2,pNVar6,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
              std::__cxx11::string::~string(local_508);
              std::allocator<char>::~allocator((allocator<char> *)&local_509);
              pNVar2 = this->Tree[1]->Tree[1];
              pNVar6 = (Node *)operator_new(0x70);
              local_532 = 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_530,"",&local_531);
              Node(pNVar6,0x203,(string *)local_530,0,0);
              local_532 = 0;
              Link(pNVar2,pNVar6,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
              std::__cxx11::string::~string(local_530);
              std::allocator<char>::~allocator((allocator<char> *)&local_531);
              VariableScan(this->Tree[1],InDefineFlag);
              return;
            }
            if (iVar3 == 0x11c) {
              return;
            }
            if (iVar3 == 0x150) {
              return;
            }
            if ((iVar3 != 0x154) && (iVar3 != 0x1a8)) {
              return;
            }
            pNVar2 = this->Tree[1]->Tree[0];
            pNVar6 = (Node *)operator_new(0x70);
            local_4e2 = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_4e0,"",&local_4e1);
            Node(pNVar6,0x203,(string *)local_4e0,0,0);
            local_4e2 = 0;
            Link(pNVar2,pNVar6,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
            std::__cxx11::string::~string(local_4e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
            VariableScan(this->Tree[1],InDefineFlag);
            return;
          }
          if (iVar3 == 0x183) {
            return;
          }
          if (iVar3 == 0x18d) {
            if (this->Tree[0] != (Node *)0x0) {
              VariableScanOne(this->Tree[0],InDefineFlag);
            }
            OnErrorFlag = 1;
            WhenErrorFlag = 1;
            return;
          }
          if (iVar3 == 399) {
            GosubFlag = 1;
            return;
          }
          if (iVar3 != 0x1a1) {
            if (iVar3 == 0x1cd) {
              pVVar5 = VariableList::Lookup(Variables,&this->TextValue,this,0);
              if (pVVar5 == (VariableStruct *)0x0) {
                std::__cxx11::string::string(local_e0,(string *)&this->TextValue);
                VariableStruct::VariableStruct
                          ((VariableStruct *)local_c0,(string *)local_e0,VARTYPE_VOID,VARCLASS_FUNC,
                           InDefineFlag,0);
                std::__cxx11::string::~string(local_e0);
                VariableList::Append(Variables,(VariableStruct *)local_c0,1);
                VariableStruct::~VariableStruct((VariableStruct *)local_c0);
              }
              else {
                pVVar5->Class = VARCLASS_FUNC;
              }
              if (this->Tree[0] != (Node *)0x0) {
                VariableScan(this->Tree[0],InDefineFlag);
              }
              if (this->Tree[3] == (Node *)0x0) {
                return;
              }
              VariableScan(this->Tree[3],1);
              return;
            }
            if (iVar3 - 0x1ceU < 3) {
              return;
            }
            if (iVar3 == 0x1d1) {
              local_270._M_current = (char *)std::__cxx11::string::end();
              local_268 = __gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator-(&local_270,1);
              pcVar4 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_268);
              if (*pcVar4 == ':') {
                local_288._M_current = (char *)std::__cxx11::string::end();
                local_280 = __gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator-(&local_288,1);
                __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                __normal_iterator<char*>
                          ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_278,
                           &local_280);
                NewVar_3.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)std::__cxx11::string::erase(&this->TextValue,local_278);
              }
              pVVar5 = VariableList::Lookup(Variables,&this->TextValue,(Node *)0x0,0);
              if (pVVar5 != (VariableStruct *)0x0) {
                return;
              }
              pppNVar1 = &NewVar_4.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::string((string *)pppNVar1,(string *)&this->TextValue);
              VariableStruct::VariableStruct
                        ((VariableStruct *)local_328,(string *)pppNVar1,VARTYPE_LABEL,VARCLASS_LABEL
                         ,1,0);
              std::__cxx11::string::~string
                        ((string *)
                         &NewVar_4.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              VariableList::Append(Variables,(VariableStruct *)local_328,0);
              VariableStruct::~VariableStruct((VariableStruct *)local_328);
              return;
            }
            if (iVar3 == 0x1d2) {
              pVVar5 = VariableList::Lookup(Variables,&this->TextValue,(Node *)0x0,0);
              if (pVVar5 == (VariableStruct *)0x0) {
                std::__cxx11::string::string(local_400,(string *)&this->TextValue);
                VariableStruct::VariableStruct
                          ((VariableStruct *)local_3e0,(string *)local_400,VARTYPE_LABEL,
                           VARCLASS_LABEL,1,0);
                std::__cxx11::string::~string(local_400);
                NewVar_4._100_4_ = NewVar_4._100_4_ + 1;
                VariableList::Append(Variables,(VariableStruct *)local_3e0,0);
                VariableStruct::~VariableStruct((VariableStruct *)local_3e0);
                return;
              }
              pVVar5->EverUsed = pVVar5->EverUsed + 1;
              return;
            }
            if (iVar3 == 0x1d3) {
              VariableList::Define(Variables,this,0,InDefineFlag);
              if (this->Tree[0] != (Node *)0x0) {
                VariableScanOne(this->Tree[0],InDefineFlag);
              }
              if (this->Tree[2] == (Node *)0x0) {
                return;
              }
              VariableScanOne(this->Tree[2],InDefineFlag);
              return;
            }
            if (iVar3 == 0x1da) {
              ScanVarList(this->Tree[0],VARTYPE_REAL,VARCLASS_NONE,1);
              return;
            }
            if (iVar3 == 0x1db) {
              ScanVarList(this->Tree[0],VARTYPE_REAL,VARCLASS_FUNC,1);
              return;
            }
            if (iVar3 == 0x1ef) {
              VariableScanOne(this->Tree[0],InDefineFlag);
              VariableScanOne(this->Tree[1],InDefineFlag);
              return;
            }
            if (iVar3 == 0x1f8) {
              GosubFlag = 1;
              VariableScanOne(this->Tree[0],InDefineFlag);
              VariableScanOne(this->Tree[1],InDefineFlag);
              return;
            }
            if (iVar3 == 0x1f9) {
              OnErrorFlag = 1;
              if (this->Tree[0] == (Node *)0x0) {
                OnErrorFlag = 1;
                return;
              }
              VariableScanOne(this->Tree[0],InDefineFlag);
              return;
            }
            if (iVar3 == 0x1fd) {
              ScanVarList(this->Tree[0],VARTYPE_REAL,VARCLASS_FUNC,1);
              return;
            }
            if (iVar3 == 0x1fe) {
              ScanVarList(this->Tree[0],VARTYPE_REAL,VARCLASS_FUNC,1);
              return;
            }
            if (iVar3 == 0x1ff) {
              ScanVarList(this->Tree[0],VARTYPE_REAL,VARCLASS_NONE,1);
              return;
            }
            if (iVar3 == 0x207) {
              LowerCase(&this->TextValue);
              if (this->Tree[0] != (Node *)0x0) {
                VariableScanOne(this->Tree[0],InDefineFlag);
              }
              if (this->Tree[2] == (Node *)0x0) {
                return;
              }
              VariableScanOne(this->Tree[2],InDefineFlag);
              return;
            }
            if (iVar3 == 0x209) {
              WhenErrorFlag = 1;
              if (this->Tree[0] == (Node *)0x0) {
                WhenErrorFlag = 1;
                return;
              }
              VariableScanOne(this->Tree[0],InDefineFlag);
              return;
            }
            if (this->Tree[0] != (Node *)0x0) {
              VariableScan(this->Tree[0],InDefineFlag);
            }
            if (this->Tree[1] != (Node *)0x0) {
              VariableScan(this->Tree[1],InDefineFlag);
            }
            if (this->Tree[2] != (Node *)0x0) {
              VariableScan(this->Tree[2],InDefineFlag);
            }
            if (this->Tree[3] != (Node *)0x0) {
              VariableScan(this->Tree[3],InDefineFlag);
            }
            if (this->Tree[4] != (Node *)0x0) {
              VariableScan(this->Tree[4],InDefineFlag);
            }
            if (this->Block[1] != (Node *)0x0) {
              VariableScan(this->Block[1],InDefineFlag);
            }
            if (this->Block[2] == (Node *)0x0) {
              return;
            }
            VariableScan(this->Block[2],InDefineFlag);
            return;
          }
        }
        if (this->Tree[0] == (Node *)0x0) {
          NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = VARTYPE_VOID;
        }
        else {
          NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = ScanType(this->Tree[0]);
        }
        pVVar5 = VariableList::Lookup(Variables,&this->Tree[1]->TextValue,this,0);
        if (pVVar5 == (VariableStruct *)0x0) {
          pppNVar1 = &NewVar_2.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::string((string *)pppNVar1,(string *)&this->Tree[1]->TextValue);
          VariableStruct::VariableStruct
                    ((VariableStruct *)local_188,(string *)pppNVar1,
                     NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,VARCLASS_FUNC,InDefineFlag,0);
          std::__cxx11::string::~string
                    ((string *)
                     &NewVar_2.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          VariableList::Append(Variables,(VariableStruct *)local_188,1);
          VariableStruct::~VariableStruct((VariableStruct *)local_188);
        }
        else {
          pVVar5->Class = VARCLASS_FUNC;
          pVVar5->Type = NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_;
        }
        if (this->Tree[3] != (Node *)0x0) {
          VariableScan(this->Tree[3],1);
        }
      }
    }
  }
  return;
}

Assistant:

void Node::VariableScanOne(
	int InDefineFlag	/**< Are we in a define statement */
)
{
	VariableStruct *ThisVar;
	VARTYPE ThisType = VARTYPE_NONE;

	//
	// Look at current node type
	//
	switch (Type)
	{
	case BAS_N_EXTERNALCONSTANT:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_NONE, true);
		break;

	case BAS_N_EXTERNALSUB:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_FUNC, true);
		break;

	case BAS_S_CALL:
		Tree[0]->ScanVarList(VARTYPE_VOID, VARCLASS_FUNC, false);
		break;

	case BAS_S_COMMON:
		ScanMap();
		break;

	case BAS_S_DATA:
		break;

	case BAS_S_DECLARE:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_NONE, true);
		break;

	case BAS_V_DECLARECONSTANT:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_NONE, true);
		break;

	case BAS_V_DECLAREFUN:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_FUNC, true);
		break;

	case BAS_S_DIM:
		if (Tree[1] != 0)
		{
			Tree[1]->VariableScanOne(1);
		}
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_NONE, true);
		break;

	case BAS_S_EXTERNAL:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_NONE, true);
		break;

	case BAS_S_MAP:
		ScanMap();
		break;

	case BAS_V_FUNCTION:
		//
		// Built in function
		//
		ThisVar = Variables->Lookup(TextValue, this);
		if (ThisVar == 0)
		{
			//
			// Create variable
			//
			VariableStruct NewVar(TextValue,
				VARTYPE_VOID, VARCLASS_FUNC, InDefineFlag);

			//
			// Add to variable table
			//
			Variables->Append(NewVar, true);	// Forced global
		}
		else
		{
			ThisVar->Class = VARCLASS_FUNC;
		}
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScan(InDefineFlag);
		}
		if (Tree[3] != 0)
		{
			Tree[3]->VariableScan(1);
		}
		break;

	case BAS_N_EXTERNALFUNCTION:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_FUNC, true);
		break;

	case BAS_S_DEF:
	case BAS_S_DEFSTAR:
		break;

	case BAS_S_FUNCTION:
	case BAS_S_SUB:

		//
		// Function Definition
		//   0 = Return type
		//   1 - Function name
		//   2 -
		//   3 - Calling Parameters
		//
		// must have a name
		//
		//
		// Functions return type
		//
		if (Tree[0] != 0)
		{
			ThisType = Tree[0]->ScanType();
		}
		else
		{
			ThisType = VARTYPE_VOID;
		}

		//
		// This functions name
		//
		ThisVar = Variables->Lookup(Tree[1]->TextValue, this);
		if (ThisVar == 0)
		{
			//
			// Create variable
			//
			VariableStruct NewVar(Tree[1]->TextValue,
				ThisType, VARCLASS_FUNC, InDefineFlag);

			//
			// Add to variable table
			//
			Variables->Append(NewVar, true);	// Forced global
		}
		else
		{
			ThisVar->Class =VARCLASS_FUNC;
			ThisVar->Type = ThisType;
		}

		//
		// Scan calling parameters
		//
		if (Tree[3] != 0)
		{
			Tree[3]->VariableScan(1);
		}

		break;

	case BAS_S_MAINFUNCTION:
		//
		// Function Definition
		//
		if (Tree[0] != 0)
		{
			ThisType = Tree[0]->ScanType();
		}
		else
		{
			ThisType = VARTYPE_VOID;
		}

		ThisVar = Variables->Lookup(Tree[2]->TextValue, this);
		if (ThisVar == 0)
		{
			//
			// Create variable
			//
			VariableStruct NewVar(Tree[2]->TextValue,
				ThisType, VARCLASS_FUNC, InDefineFlag);

			//
			// Add to variable table
			//
			Variables->Append(NewVar, 1);		// Forced global
		}
		else
		{
			ThisVar->Class = VARCLASS_FUNC;
			ThisVar->Type = ThisType;
		}

		//
		// Scan calling parameters
		//
		if (Tree[2]->Tree[0] != 0)
		{
			Tree[2]->Tree[0]->VariableScan(1);
		}

		break;

	case BAS_V_LABEL:
		if (*(TextValue.end() - 1) == ':')
		{
#ifdef STLREMOVE
			TextValue.remove(TextValue.end() - 1);
#else
			TextValue.erase(TextValue.end() - 1);
#endif
		}
		ThisVar = Variables->Lookup(TextValue, 0);
		if (ThisVar == 0)
		{
			VariableStruct NewVar(TextValue,
				VARTYPE_LABEL, VARCLASS_LABEL, true);
			Variables->Append(NewVar);
		}
		break;

	case BAS_V_USELABEL:
		ThisVar = Variables->Lookup(TextValue, 0);
		if (ThisVar == 0)
		{
			VariableStruct NewVar(TextValue,
				VARTYPE_LABEL, VARCLASS_LABEL, true);
			NewVar.EverUsed++;
			Variables->Append(NewVar);
		}
		else
		{
			ThisVar->EverUsed++;
		}
		break;

	case BAS_V_NAME:
		Variables->Define(this, false, InDefineFlag);

		//
		// Look at possible array reference
		//
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScanOne(InDefineFlag);
		}

		if (Tree[2] != 0)
		{
			Tree[2]->VariableScanOne(InDefineFlag);
		}

		break;

	case BAS_S_RECORD:
//
// FIXME:
// We don't scan the structure names because they are not real
// (ie. expposed to the outside world).
// We should probibly create some kind of definition list for structure
// definitions.
//
//		Tree[0]->VariableScanOne(1);
		break;

	case BAS_N_STRUCTNAME:

		//
		// Force structure variable to be usable under C++
		//
		LowerCase(TextValue);

		//
		// Look at possible array reference
		//
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScanOne(InDefineFlag);
		}

		if (Tree[2] != 0)
		{
			Tree[2]->VariableScanOne(InDefineFlag);
		}

		break;

	case BAS_X_STRREF:

		Tree[0]->VariableScanOne(InDefineFlag);
		Tree[1]->VariableScanOne(InDefineFlag);

		break;

	case BAS_S_GOSUB:
		GosubFlag = 1;
		Tree[0]->VariableScanOne(InDefineFlag);
		break;

	case BAS_N_ONERROR:
		OnErrorFlag = 1;
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScanOne(InDefineFlag);
		}
		break;

	case BAS_N_WHENERRORIN:
		WhenErrorFlag = 1;
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScanOne(InDefineFlag);
		}
		break;

	case BAS_N_ONGOSUB:
		GosubFlag = 1;
		Tree[0]->VariableScanOne(InDefineFlag);
		Tree[1]->VariableScanOne(InDefineFlag);
		break;

	case BAS_S_RETURN:
		GosubFlag = 1;
		break;

	case BAS_S_RESUME:
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScanOne(InDefineFlag);
		}
		OnErrorFlag = 1;
		WhenErrorFlag = 1;
		break;

	case '+':
		//
		// Process lower levels first
		//
		Tree[0]->VariableScanOne(InDefineFlag);
		Tree[1]->VariableScanOne(InDefineFlag);

		//
		// Let's try and merge text strings together
		//
		if (Tree[0]->IsReallyString() && Tree[1]->IsReallyString())
		{
			//
			// Create merged string (Using the colon
			// concatination options)
			//
			std::string Merger = Tree[0]->TextValue + Tree[1]->TextValue;

			//
			// Change the root node to the concatinated string
			// type.
			//
			Type = BAS_V_TEXTSTRING;
			delete Tree[0];
			Tree[0] = 0;
			delete Tree[1];
			Tree[1] = 0;
			TextValue = Merger;
		}
		break;

	case BAS_S_CHANGE:
		//
		// This is a strange statement, and we need to determine
		// which one is a string and which one is a numeric
		// array.
		//
		{
			//
			// Assume 2nd one is a string
			//
			VARTYPE Type1 = VARTYPE_DYNSTR;
			if (Tree[1]->Type != BAS_V_NAME)
			{
				//
				// If it isn't a variable name, it better be
				// a string. (You can't add arrays)
				//
				Type1 = VARTYPE_DYNSTR;
			}
			else
			{
				//
				// Does it already have a defined type?
				//
				ThisVar = Variables->Lookup(Tree[1]->TextValue, 0);
				if ((ThisVar != 0) &&
					(ThisVar->Type == VARTYPE_DYNSTR))
				{
					Type1 = ThisVar->Type;
				}
				else
				{
					Type1 = GuessVarType(Tree[0]->TextValue);
				}
			}
			//
			// Ok, now force one of them to be an array
			//
			if (Type1 == VARTYPE_DYNSTR)
			{
				// change a% to b$
				Type = BAS_S_CHANGE2;
				Tree[0]->Link(new Node(BAS_N_NULL));
			}
			else
			{
				// change a$ to b%
				Type = BAS_S_CHANGE1;
				Tree[1]->Link(new Node(BAS_N_NULL));
			}
		}
		Tree[0]->VariableScan(InDefineFlag);
		Tree[1]->VariableScan(InDefineFlag);
		break;

	case BAS_S_MAT:
		//
		// Force array type to l-value
		//
		Tree[0]->Link(new Node(BAS_N_NULL));
		Tree[0]->VariableScan(InDefineFlag);

		switch(Tree[1]->Type)
		{
		case BAS_S_CON:		// MAT xxx = ZER
		case BAS_S_IDN:
		case BAS_S_ZER:
			break;

		case BAS_S_TRN:		// MAT xxx = TRN(yyy)
		case BAS_S_INV:
			//
			// rvalue MUST be array
			//
			Tree[1]->Tree[0]->Link(new Node(BAS_N_NULL));
			Tree[1]->VariableScan(InDefineFlag);
			break;

		case '+':			// MAT xxx = yyy + zzz
		case '-':
		case '*':
			//
			// Two rvalues MUST be arrays
			//
			Tree[1]->Tree[0]->Link(new Node(BAS_N_NULL));
			Tree[1]->Tree[1]->Link(new Node(BAS_N_NULL));
			Tree[1]->VariableScan(InDefineFlag);
			break;

		case '(':			// MAT xxx = (yyy) * zzz
			//
			// right rvalue values MUST be arrays
			//
			Tree[1]->Tree[1]->Link(new Node(BAS_N_NULL));
			Tree[1]->Tree[0]->VariableScan(InDefineFlag);
			Tree[1]->Tree[1]->VariableScan(InDefineFlag);
			break;

		default:			// Oops, forgot to code something
			break;
		}

		break;

	case BAS_V_INTEGER:
	case BAS_V_FLOAT:
	case BAS_V_INT:
		// Ignore various numeric constants
		break;

	default:
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScan(InDefineFlag);
		}

		if (Tree[1] != 0)
		{
			Tree[1]->VariableScan(InDefineFlag);
		}

		if (Tree[2] != 0)
		{
			Tree[2]->VariableScan(InDefineFlag);
		}

		if (Tree[3] != 0)
		{
			Tree[3]->VariableScan(InDefineFlag);
		}

		if (Tree[4] != 0)
		{
			Tree[4]->VariableScan(InDefineFlag);
		}

		if (Block[1] != 0)
		{
			Block[1]->VariableScan(InDefineFlag);
		}

		if (Block[2] != 0)
		{
			Block[2]->VariableScan(InDefineFlag);
		}
		break;
	}
}